

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int geopolyInit(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr,
               int isCreate)

{
  long lVar1;
  sqlite3 *db_00;
  Rtree *pRtree_00;
  undefined8 *__s;
  sqlite3_str *p;
  char *pcVar2;
  sqlite3 *in_RCX;
  int in_EDX;
  sqlite3 *in_RSI;
  Rtree *in_RDI;
  char *in_R8;
  undefined8 *in_R9;
  int ii;
  char *zSql;
  sqlite3_str *pSql;
  sqlite3_int64 nName;
  sqlite3_int64 nDb;
  Rtree *pRtree;
  int rc;
  sqlite3_uint64 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int iVar3;
  sqlite3 *psVar4;
  int isCreate_00;
  int local_3c;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  psVar4 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  sqlite3_vtab_config((sqlite3 *)in_RDI,1);
  sqlite3_vtab_config((sqlite3 *)in_RDI);
  db_00 = (sqlite3 *)strlen((char *)in_RCX->pVdbe);
  pRtree_00 = (Rtree *)strlen((char *)in_RCX->pDfltColl);
  __s = (undefined8 *)sqlite3_malloc64(in_stack_ffffffffffffff88);
  if (__s == (undefined8 *)0x0) {
    local_4 = 7;
  }
  else {
    memset(__s,0,(long)db_00[1].aLimit + (long)pRtree_00 * 2 + 0x38);
    *(undefined4 *)(__s + 9) = 1;
    *__s = &rtreeModule;
    __s[6] = __s + 0x79;
    __s[7] = (long)&db_00->pVfs + __s[6] + 1;
    __s[8] = (long)&(pRtree_00->base).pModule + __s[7] + 1;
    *(undefined1 *)((long)__s + 0x26) = 0;
    *(undefined1 *)((long)__s + 0x24) = 2;
    *(undefined1 *)((long)__s + 0x25) = 4;
    memcpy((void *)__s[6],in_RCX->pVdbe,(size_t)db_00);
    memcpy((void *)__s[7],in_RCX->pDfltColl,(size_t)pRtree_00);
    memcpy((void *)__s[8],in_RCX->pDfltColl,(size_t)pRtree_00);
    lVar1 = __s[8];
    *(undefined4 *)((long)&(pRtree_00->base).pModule + lVar1) = 0x646f6e5f;
    *(undefined2 *)((long)&(pRtree_00->base).pModule + lVar1 + 4) = 0x65;
    p = sqlite3_str_new(psVar4);
    sqlite3_str_appendf(p,"CREATE TABLE x(_shape");
    *(undefined1 *)((long)__s + 0x29) = 1;
    *(undefined1 *)((long)__s + 0x2a) = 1;
    for (iVar3 = 3; iVar3 < in_EDX; iVar3 = iVar3 + 1) {
      *(char *)((long)__s + 0x29) = *(char *)((long)__s + 0x29) + '\x01';
      sqlite3_str_appendf(p,",%s",(&in_RCX->pVfs)[iVar3]);
    }
    sqlite3_str_appendf(p,");");
    isCreate_00 = (int)((ulong)p >> 0x20);
    psVar4 = (sqlite3 *)sqlite3_str_finish((sqlite3_str *)CONCAT44(iVar3,in_stack_ffffffffffffff90))
    ;
    if (psVar4 == (sqlite3 *)0x0) {
      local_3c = 7;
    }
    else {
      local_3c = sqlite3_declare_vtab(in_RCX,in_R8);
      if (local_3c != 0) {
        pcVar2 = sqlite3_errmsg(psVar4);
        pcVar2 = sqlite3_mprintf("%s",pcVar2);
        *in_R9 = pcVar2;
      }
    }
    sqlite3_free((void *)0x2a409f);
    if (local_3c == 0) {
      *(char *)((long)__s + 0x27) = *(char *)((long)__s + 0x25) * '\x04' + '\b';
      local_3c = getNodeSize(db_00,pRtree_00,isCreate_00,(char **)psVar4);
      if (local_3c == 0) {
        local_3c = rtreeSqlInit(in_RDI,in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                                (char *)in_RCX,(int)((ulong)in_R8 >> 0x20));
        if (local_3c == 0) {
          *(undefined8 **)in_R8 = __s;
          return 0;
        }
        pcVar2 = sqlite3_errmsg(psVar4);
        pcVar2 = sqlite3_mprintf("%s",pcVar2);
        *in_R9 = pcVar2;
      }
    }
    if (local_3c == 0) {
      local_3c = 1;
    }
    rtreeRelease((Rtree *)0x2a4178);
    local_4 = local_3c;
  }
  return local_4;
}

Assistant:

static int geopolyInit(
  sqlite3 *db,                        /* Database connection */
  void *pAux,                         /* One of the RTREE_COORD_* constants */
  int argc, const char *const*argv,   /* Parameters to CREATE TABLE statement */
  sqlite3_vtab **ppVtab,              /* OUT: New virtual table */
  char **pzErr,                       /* OUT: Error message, if any */
  int isCreate                        /* True for xCreate, false for xConnect */
){
  int rc = SQLITE_OK;
  Rtree *pRtree;
  sqlite3_int64 nDb;              /* Length of string argv[1] */
  sqlite3_int64 nName;            /* Length of string argv[2] */
  sqlite3_str *pSql;
  char *zSql;
  int ii;
  (void)pAux;

  sqlite3_vtab_config(db, SQLITE_VTAB_CONSTRAINT_SUPPORT, 1);
  sqlite3_vtab_config(db, SQLITE_VTAB_INNOCUOUS);

  /* Allocate the sqlite3_vtab structure */
  nDb = strlen(argv[1]);
  nName = strlen(argv[2]);
  pRtree = (Rtree *)sqlite3_malloc64(sizeof(Rtree)+nDb+nName*2+8);
  if( !pRtree ){
    return SQLITE_NOMEM;
  }
  memset(pRtree, 0, sizeof(Rtree)+nDb+nName*2+8);
  pRtree->nBusy = 1;
  pRtree->base.pModule = &rtreeModule;
  pRtree->zDb = (char *)&pRtree[1];
  pRtree->zName = &pRtree->zDb[nDb+1];
  pRtree->zNodeName = &pRtree->zName[nName+1];
  pRtree->eCoordType = RTREE_COORD_REAL32;
  pRtree->nDim = 2;
  pRtree->nDim2 = 4;
  memcpy(pRtree->zDb, argv[1], nDb);
  memcpy(pRtree->zName, argv[2], nName);
  memcpy(pRtree->zNodeName, argv[2], nName);
  memcpy(&pRtree->zNodeName[nName], "_node", 6);


  /* Create/Connect to the underlying relational database schema. If
  ** that is successful, call sqlite3_declare_vtab() to configure
  ** the r-tree table schema.
  */
  pSql = sqlite3_str_new(db);
  sqlite3_str_appendf(pSql, "CREATE TABLE x(_shape");
  pRtree->nAux = 1;         /* Add one for _shape */
  pRtree->nAuxNotNull = 1;  /* The _shape column is always not-null */
  for(ii=3; ii<argc; ii++){
    pRtree->nAux++;
    sqlite3_str_appendf(pSql, ",%s", argv[ii]);
  }
  sqlite3_str_appendf(pSql, ");");
  zSql = sqlite3_str_finish(pSql);
  if( !zSql ){
    rc = SQLITE_NOMEM;
  }else if( SQLITE_OK!=(rc = sqlite3_declare_vtab(db, zSql)) ){
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
  }
  sqlite3_free(zSql);
  if( rc ) goto geopolyInit_fail;
  pRtree->nBytesPerCell = 8 + pRtree->nDim2*4;

  /* Figure out the node size to use. */
  rc = getNodeSize(db, pRtree, isCreate, pzErr);
  if( rc ) goto geopolyInit_fail;
  rc = rtreeSqlInit(pRtree, db, argv[1], argv[2], isCreate);
  if( rc ){
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
    goto geopolyInit_fail;
  }

  *ppVtab = (sqlite3_vtab *)pRtree;
  return SQLITE_OK;

geopolyInit_fail:
  if( rc==SQLITE_OK ) rc = SQLITE_ERROR;
  assert( *ppVtab==0 );
  assert( pRtree->nBusy==1 );
  rtreeRelease(pRtree);
  return rc;
}